

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall QList<QGridBox_*>::remove(QList<QGridBox_*> *this,char *__filename)

{
  QList<QGridBox_*> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  QGridBox **in_stack_00000018;
  QPodArrayOps<QGridBox_*> *in_stack_00000020;
  QArrayDataPointer<QGridBox_*> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<QGridBox_*>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<QGridBox_*>::operator->(&this->d);
    QArrayDataPointer<QGridBox_*>::operator->(&this->d);
    QArrayDataPointer<QGridBox_*>::begin((QArrayDataPointer<QGridBox_*> *)0x338099);
    QtPrivate::QPodArrayOps<QGridBox_*>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}